

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O2

void __thiscall llvm::Twine::printOneChild(Twine *this,raw_ostream *OS,Child Ptr,NodeKind Kind)

{
  unsigned_long N;
  undefined7 in_register_00000009;
  
  switch((int)CONCAT71(in_register_00000009,Kind)) {
  case 2:
    print(Ptr.twine,OS);
    return;
  case 3:
    raw_ostream::operator<<(OS,Ptr.cString);
    return;
  case 4:
    raw_ostream::operator<<(OS,Ptr.stdString);
    return;
  case 5:
    raw_ostream::operator<<(OS,*Ptr.stringRef);
    return;
  case 6:
    raw_ostream::operator<<(OS,Ptr.smallString);
    return;
  case 7:
    raw_ostream::operator<<(OS,Ptr.formatvObject);
    return;
  case 8:
    raw_ostream::operator<<(OS,Ptr.character);
    return;
  case 9:
    N = (ulong)Ptr.twine & 0xffffffff;
    break;
  case 10:
    raw_ostream::operator<<(OS,Ptr.decI);
    return;
  case 0xb:
    N = *Ptr.decUL;
    break;
  case 0xc:
    raw_ostream::operator<<(OS,*Ptr.decL);
    return;
  case 0xd:
    raw_ostream::operator<<(OS,*Ptr.decULL);
    return;
  case 0xe:
    raw_ostream::operator<<(OS,*Ptr.decLL);
    return;
  case 0xf:
    raw_ostream::write_hex(OS,*Ptr.decULL);
    return;
  default:
    return;
  }
  raw_ostream::operator<<(OS,N);
  return;
}

Assistant:

void Twine::printOneChild(raw_ostream &OS, Child Ptr,
                          NodeKind Kind) const {
  switch (Kind) {
  case Twine::NullKind: break;
  case Twine::EmptyKind: break;
  case Twine::TwineKind:
    Ptr.twine->print(OS);
    break;
  case Twine::CStringKind:
    OS << Ptr.cString;
    break;
  case Twine::StdStringKind:
    OS << *Ptr.stdString;
    break;
  case Twine::StringRefKind:
    OS << *Ptr.stringRef;
    break;
  case Twine::SmallStringKind:
    OS << *Ptr.smallString;
    break;
  case Twine::FormatvObjectKind:
    OS << *Ptr.formatvObject;
    break;
  case Twine::CharKind:
    OS << Ptr.character;
    break;
  case Twine::DecUIKind:
    OS << Ptr.decUI;
    break;
  case Twine::DecIKind:
    OS << Ptr.decI;
    break;
  case Twine::DecULKind:
    OS << *Ptr.decUL;
    break;
  case Twine::DecLKind:
    OS << *Ptr.decL;
    break;
  case Twine::DecULLKind:
    OS << *Ptr.decULL;
    break;
  case Twine::DecLLKind:
    OS << *Ptr.decLL;
    break;
  case Twine::UHexKind:
    OS.write_hex(*Ptr.uHex);
    break;
  }
}